

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

tnt_error tnt_io_xbufmax(tnt_stream_net *s,int opt,int min)

{
  int iVar1;
  uint local_20;
  int local_1c;
  uint avg;
  int max;
  int min_local;
  int opt_local;
  tnt_stream_net *s_local;
  
  local_1c = 0x8000000;
  avg = min;
  max = opt;
  _min_local = s;
  if (min == 0) {
    avg = 0x4000;
  }
  while ((int)avg <= local_1c) {
    local_20 = avg + local_1c >> 1;
    iVar1 = setsockopt(_min_local->fd,1,max,&local_20,4);
    if (iVar1 == 0) {
      avg = local_20 + 1;
    }
    else {
      local_1c = local_20 - 1;
    }
  }
  return TNT_EOK;
}

Assistant:

static enum tnt_error tnt_io_xbufmax(struct tnt_stream_net *s, int opt, int min) {
	int max = 128 * 1024 * 1024;
	if (min == 0)
		min = 16384;
	unsigned int avg = 0;
	while (min <= max) {
		avg = ((unsigned int)(min + max)) / 2;
		if (setsockopt(s->fd, SOL_SOCKET, opt, &avg, sizeof(avg)) == 0)
			min = avg + 1;
		else
			max = avg - 1;
	}
	return TNT_EOK;
}